

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O2

void __thiscall
FMultiPatchTexture::FMultiPatchTexture(FMultiPatchTexture *this,FScanner *sc,int usetype)

{
  undefined1 *puVar1;
  FString *this_00;
  double dVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  TexPart *__dest;
  ulong *puVar11;
  FScanner *pFVar12;
  long lVar13;
  int i;
  char *pcVar14;
  TexPart *this_01;
  ulong uVar15;
  TexInit *this_02;
  long lVar16;
  TexInit init;
  TexPart part;
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart> parts;
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit> inits;
  FScriptPosition local_40;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FMultiPatchTexture_00704330;
  this->Parts = (TexPart *)0x0;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->field_0x80 = this->field_0x80 & 0xfc;
  parts.Array = (TexPart *)0x0;
  parts.Most = 0;
  parts.Count = 0;
  inits.Array = (TexInit *)0x0;
  inits.Most = 0;
  inits.Count = 0;
  puVar1 = &(this->super_FTexture).field_0x32;
  *puVar1 = *puVar1 | 2;
  FScanner::SetCMode(sc,true);
  FScanner::MustGetString(sc);
  pcVar14 = "optional";
  bVar8 = FScanner::Compare(sc,"optional");
  if (bVar8) {
    FScanner::MustGetString(sc);
    bVar9 = FScanner::Compare(sc,",");
    bVar8 = true;
    if (bVar9) {
      FScanner::UnGet(sc);
      bVar8 = false;
      goto LAB_004e7d5a;
    }
  }
  else {
    bVar8 = false;
  }
  pcVar14 = sc->String;
LAB_004e7d5a:
  this_00 = &(this->super_FTexture).Name;
  FString::operator=(this_00,pcVar14);
  FString::ToUpper(this_00);
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Width = (WORD)sc->Number;
  FScanner::MustGetStringName(sc,",");
  FScanner::MustGetNumber(sc);
  (this->super_FTexture).Height = (WORD)sc->Number;
  (this->super_FTexture).UseType = (BYTE)usetype;
  bVar9 = FScanner::CheckString(sc,"{");
  if (bVar9) {
    while (bVar9 = FScanner::CheckString(sc,"}"), uVar6 = parts._8_8_, !bVar9) {
      FScanner::MustGetString(sc);
      bVar9 = FScanner::Compare(sc,"XScale");
      if (bVar9) {
        FScanner::MustGetFloat(sc);
        dVar2 = sc->Float;
        (this->super_FTexture).Scale.X = dVar2;
        pcVar14 = "Texture %s is defined with null x-scale\n";
LAB_004e7e7b:
        if ((dVar2 == 0.0) && (pFVar12 = (FScanner *)this_00, !NAN(dVar2))) {
LAB_004e7e87:
          FScanner::ScriptError(sc,pcVar14,pFVar12->String);
        }
      }
      else {
        bVar9 = FScanner::Compare(sc,"YScale");
        if (bVar9) {
          FScanner::MustGetFloat(sc);
          dVar2 = sc->Float;
          (this->super_FTexture).Scale.Y = dVar2;
          pcVar14 = "Texture %s is defined with null y-scale\n";
          goto LAB_004e7e7b;
        }
        bVar9 = FScanner::Compare(sc,"WorldPanning");
        if (bVar9) {
          puVar1 = &(this->super_FTexture).field_0x31;
          *puVar1 = *puVar1 | 4;
        }
        else {
          bVar9 = FScanner::Compare(sc,"NullTexture");
          if (bVar9) {
            (this->super_FTexture).UseType = '\r';
          }
          else {
            bVar9 = FScanner::Compare(sc,"NoDecals");
            if (bVar9) {
              puVar1 = &(this->super_FTexture).field_0x31;
              *puVar1 = *puVar1 | 1;
            }
            else {
              bVar9 = FScanner::Compare(sc,"Patch");
              if (bVar9) {
                part.OriginX = 0;
                part.OriginY = 0;
                part.Rotate = '\0';
                part.op = '\0';
                part.Texture = (FTexture *)0x0;
                part.Translation = (FRemapTable *)0x0;
                part.Blend.field_0 =
                     (anon_union_4_2_12391d7c_for_PalEntry_0)
                     (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
                part.Alpha = 0x10000;
                init.TexName.Chars = FString::NullString.Nothing;
                init.UseType = 0xd;
                init.Silent = false;
                init.HasLine = false;
                init.UseOffsets = false;
                FString::NullString.RefCount = FString::NullString.RefCount + 2;
                init.sc.FileName.Chars = FString::NullString.Nothing;
                init.sc.ScriptLine = 0;
                ParsePatch(this,sc,&part,&init);
                if (*(int *)(init.TexName.Chars + -0xc) != 0) {
                  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                            (&parts,&part);
                  init.UseType = 4;
                  init.HasLine = true;
                  init.Silent = bVar8;
                  FScriptPosition::FScriptPosition(&local_40,sc);
                  FScriptPosition::operator=(&init.sc,&local_40);
                  FString::~FString(&local_40.FileName);
                  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                            (&inits,&init);
                }
LAB_004e81cc:
                part.Texture = (FTexture *)0x0;
                part.Translation = (FRemapTable *)0x0;
                TexInit::~TexInit(&init);
              }
              else {
                bVar9 = FScanner::Compare(sc,"Sprite");
                if (bVar9) {
                  part.OriginX = 0;
                  part.OriginY = 0;
                  part.Rotate = '\0';
                  part.op = '\0';
                  part.Texture = (FTexture *)0x0;
                  part.Translation = (FRemapTable *)0x0;
                  part.Blend.field_0 =
                       (anon_union_4_2_12391d7c_for_PalEntry_0)
                       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
                  part.Alpha = 0x10000;
                  init.TexName.Chars = FString::NullString.Nothing;
                  init.UseType = 0xd;
                  init.Silent = false;
                  init.HasLine = false;
                  init.UseOffsets = false;
                  FString::NullString.RefCount = FString::NullString.RefCount + 2;
                  init.sc.FileName.Chars = FString::NullString.Nothing;
                  init.sc.ScriptLine = 0;
                  ParsePatch(this,sc,&part,&init);
                  if (*(int *)(init.TexName.Chars + -0xc) != 0) {
                    TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                              (&parts,&part);
                    init.UseType = 3;
                    init.HasLine = true;
                    init.Silent = bVar8;
                    FScriptPosition::FScriptPosition(&local_40,sc);
                    FScriptPosition::operator=(&init.sc,&local_40);
                    FString::~FString(&local_40.FileName);
                    TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                              (&inits,&init);
                  }
                  goto LAB_004e81cc;
                }
                bVar9 = FScanner::Compare(sc,"Graphic");
                if (bVar9) {
                  part.OriginX = 0;
                  part.OriginY = 0;
                  part.Rotate = '\0';
                  part.op = '\0';
                  part.Texture = (FTexture *)0x0;
                  part.Translation = (FRemapTable *)0x0;
                  part.Blend.field_0 =
                       (anon_union_4_2_12391d7c_for_PalEntry_0)
                       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
                  part.Alpha = 0x10000;
                  init.TexName.Chars = FString::NullString.Nothing;
                  init.UseType = 0xd;
                  init.Silent = false;
                  init.HasLine = false;
                  init.UseOffsets = false;
                  FString::NullString.RefCount = FString::NullString.RefCount + 2;
                  init.sc.FileName.Chars = FString::NullString.Nothing;
                  init.sc.ScriptLine = 0;
                  ParsePatch(this,sc,&part,&init);
                  if (*(int *)(init.TexName.Chars + -0xc) != 0) {
                    TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::Push
                              (&parts,&part);
                    init.UseType = 8;
                    init.HasLine = true;
                    init.Silent = bVar8;
                    FScriptPosition::FScriptPosition(&local_40,sc);
                    FScriptPosition::operator=(&init.sc,&local_40);
                    FString::~FString(&local_40.FileName);
                    TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::Push
                              (&inits,&init);
                  }
                  goto LAB_004e81cc;
                }
                bVar9 = FScanner::Compare(sc,"Offset");
                pcVar14 = "Unknown texture property \'%s\'";
                pFVar12 = sc;
                if (!bVar9) goto LAB_004e7e87;
                FScanner::MustGetNumber(sc);
                (this->super_FTexture).LeftOffset = (SWORD)sc->Number;
                FScanner::MustGetStringName(sc,",");
                FScanner::MustGetNumber(sc);
                (this->super_FTexture).TopOffset = (SWORD)sc->Number;
              }
            }
          }
        }
      }
    }
    uVar7 = parts.Count;
    uVar15 = (ulong)(int)parts.Count;
    this->NumParts = parts.Count;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar15;
    uVar10 = SUB168(auVar5 * ZEXT816(0x28),0);
    if (SUB168(auVar5 * ZEXT816(0x28),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    __dest = (TexPart *)operator_new__(uVar10);
    if (uVar7 != 0) {
      lVar13 = uVar15 * 0x28;
      this_01 = __dest;
      do {
        TexPart::TexPart(this_01);
        this_01 = this_01 + 1;
        lVar13 = lVar13 + -0x28;
      } while (lVar13 != 0);
    }
    this->Parts = __dest;
    memcpy(__dest,parts.Array,uVar15 * 0x28);
    uVar10 = uVar15 * 0x20 + 8;
    if ((long)uVar6 < 0) {
      uVar10 = 0xffffffffffffffff;
    }
    puVar11 = (ulong *)operator_new__(uVar10);
    *puVar11 = uVar15;
    if (uVar7 != 0) {
      lVar13 = 0;
      this_02 = (TexInit *)(puVar11 + 1);
      do {
        TexInit::TexInit(this_02);
        lVar13 = lVar13 + -0x20;
        this_02 = this_02 + 1;
      } while (-lVar13 != uVar15 * 0x20);
    }
    this->Inits = (TexInit *)(puVar11 + 1);
    lVar16 = 0;
    for (lVar13 = 0; lVar13 < this->NumParts; lVar13 = lVar13 + 1) {
      TexInit::operator=((TexInit *)((long)&(this->Inits->TexName).Chars + lVar16),
                         (TexInit *)((long)&((inits.Array)->TexName).Chars + lVar16));
      lVar16 = lVar16 + 0x20;
    }
  }
  uVar3 = (this->super_FTexture).Width;
  uVar4 = (this->super_FTexture).Height;
  if (uVar4 == 0 || uVar3 == 0) {
    (this->super_FTexture).UseType = '\r';
    Printf("Texture %s has invalid dimensions (%d, %d)\n",(this->super_FTexture).Name.Chars,
           (ulong)uVar3,(ulong)uVar4);
    (this->super_FTexture).Width = 1;
    (this->super_FTexture).Height = 1;
  }
  FTexture::CalcBitSize(&this->super_FTexture);
  FScanner::SetCMode(sc,false);
  TArray<FMultiPatchTexture::TexInit,_FMultiPatchTexture::TexInit>::~TArray(&inits);
  TArray<FMultiPatchTexture::TexPart,_FMultiPatchTexture::TexPart>::~TArray(&parts);
  return;
}

Assistant:

FMultiPatchTexture::FMultiPatchTexture (FScanner &sc, int usetype)
: Pixels (0), Spans(0), Parts(0), bRedirect(false), bTranslucentPatches(false)
{
	TArray<TexPart> parts;
	TArray<TexInit> inits;
	bool bSilent = false;

	bMultiPatch = true;
	sc.SetCMode(true);
	sc.MustGetString();
	const char* textureName = NULL;
	if (sc.Compare("optional"))
	{
		bSilent = true;
		sc.MustGetString();
		if (sc.Compare(","))
		{
			// this is not right. Apparently a texture named 'optional' is being defined right now...
			sc.UnGet();
			textureName = "optional";
			bSilent = false;
		}
	}
	Name = !textureName ? sc.String : textureName;
	Name.ToUpper();
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Width = sc.Number;
	sc.MustGetStringName(",");
	sc.MustGetNumber();
	Height = sc.Number;
	UseType = usetype;
	
	if (sc.CheckString("{"))
	{
		while (!sc.CheckString("}"))
		{
			sc.MustGetString();
			if (sc.Compare("XScale"))
			{
				sc.MustGetFloat();
				Scale.X = sc.Float;
				if (Scale.X == 0) sc.ScriptError("Texture %s is defined with null x-scale\n", Name.GetChars());
			}
			else if (sc.Compare("YScale"))
			{
				sc.MustGetFloat();
				Scale.Y = sc.Float;
				if (Scale.Y == 0) sc.ScriptError("Texture %s is defined with null y-scale\n", Name.GetChars());
			}
			else if (sc.Compare("WorldPanning"))
			{
				bWorldPanning = true;
			}
			else if (sc.Compare("NullTexture"))
			{
				UseType = FTexture::TEX_Null;
			}
			else if (sc.Compare("NoDecals"))
			{
				bNoDecals = true;
			}
			else if (sc.Compare("Patch"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_WallPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Sprite"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_Sprite;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Graphic"))
			{
				TexPart part;
				TexInit init;
				ParsePatch(sc, part, init);
				if (init.TexName.IsNotEmpty())
				{
					parts.Push(part);
					init.UseType = TEX_MiscPatch;
					init.Silent = bSilent;
					init.HasLine = true;
					init.sc = sc;
					inits.Push(init);
				}
				part.Texture = NULL;
				part.Translation = NULL;
			}
			else if (sc.Compare("Offset"))
			{
				sc.MustGetNumber();
				LeftOffset = sc.Number;
				sc.MustGetStringName(",");
				sc.MustGetNumber();
				TopOffset = sc.Number;
			}
			else
			{
				sc.ScriptError("Unknown texture property '%s'", sc.String);
			}
		}

		NumParts = parts.Size();
		Parts = new TexPart[NumParts];
		memcpy(Parts, &parts[0], NumParts * sizeof(*Parts));
		Inits = new TexInit[NumParts];
		for (int i = 0; i < NumParts; i++)
		{
			Inits[i] = inits[i];
		}
	}
	
	if (Width <= 0 || Height <= 0)
	{
		UseType = FTexture::TEX_Null;
		Printf("Texture %s has invalid dimensions (%d, %d)\n", Name.GetChars(), Width, Height);
		Width = Height = 1;
	}
	CalcBitSize ();

	
	sc.SetCMode(false);
}